

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O2

bool __thiscall ON_3dmRenderSettings::ReadV5(ON_3dmRenderSettings *this,ON_BinaryArchive *file)

{
  bool bVar1;
  LengthUnitSystem LVar2;
  int b;
  int version;
  int i;
  int local_24;
  ON__INT32 local_20;
  uint local_1c;
  
  local_20 = 0;
  bVar1 = ON_BinaryArchive::ReadInt(file,&local_20);
  if (!bVar1) {
    return false;
  }
  if (99 < local_20 - 100U) {
    return false;
  }
  bVar1 = ON_BinaryArchive::ReadInt(file,&local_24);
  if (bVar1) {
    this->m_bCustomImageSize = local_24 != 0;
    bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_image_width);
    if (((((bVar1) && (bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_image_height), bVar1)) &&
         (bVar1 = ON_BinaryArchive::ReadColor(file,&this->m_ambient_light), bVar1)) &&
        ((bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_background_style), bVar1 &&
         (bVar1 = ON_BinaryArchive::ReadColor(file,&this->m_background_color), bVar1)))) &&
       ((bVar1 = ON_BinaryArchive::ReadString(file,&this->m_background_bitmap_filename), bVar1 &&
        (bVar1 = ON_BinaryArchive::ReadInt(file,&local_24), bVar1)))) {
      this->m_bUseHiddenLights = local_24 != 0;
      bVar1 = ON_BinaryArchive::ReadInt(file,&local_24);
      if (bVar1) {
        this->m_bDepthCue = local_24 != 0;
        bVar1 = ON_BinaryArchive::ReadInt(file,&local_24);
        if (bVar1) {
          this->m_bFlatShade = local_24 != 0;
          bVar1 = ON_BinaryArchive::ReadInt(file,&local_24);
          if (bVar1) {
            this->m_bRenderBackfaces = local_24 != 0;
            bVar1 = ON_BinaryArchive::ReadInt(file,&local_24);
            if (bVar1) {
              this->m_bRenderPoints = local_24 != 0;
              bVar1 = ON_BinaryArchive::ReadInt(file,&local_24);
              if (bVar1) {
                this->m_bRenderCurves = local_24 != 0;
                bVar1 = ON_BinaryArchive::ReadInt(file,&local_24);
                if (bVar1) {
                  this->m_bRenderIsoparams = local_24 != 0;
                  bVar1 = ON_BinaryArchive::ReadInt(file,&local_24);
                  if (bVar1) {
                    this->m_bRenderMeshEdges = local_24 != 0;
                    bVar1 = ON_BinaryArchive::ReadInt(file,&local_24);
                    if (bVar1) {
                      this->m_bRenderAnnotation = local_24 != 0;
                      bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_antialias_style);
                      if (((bVar1) &&
                          (bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_shadowmap_style), bVar1))
                         && ((bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_shadowmap_width),
                             bVar1 && ((bVar1 = ON_BinaryArchive::ReadInt
                                                          (file,&this->m_shadowmap_height), bVar1 &&
                                       (bVar1 = ON_BinaryArchive::ReadDouble
                                                          (file,&this->m_shadowmap_offset), bVar1)))
                             ))) {
                        if (local_20 < 0x65) {
                          return true;
                        }
                        bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m_image_dpi);
                        if ((bVar1) &&
                           (bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_1c), bVar1))
                        {
                          LVar2 = ON::LengthUnitSystemFromUnsigned(local_1c);
                          this->m_image_us = LVar2;
                          if (local_20 < 0x66) {
                            return true;
                          }
                          bVar1 = ON_BinaryArchive::ReadColor(file,&this->m_background_bottom_color)
                          ;
                          if (bVar1) {
                            if (local_20 < 0x67) {
                              return true;
                            }
                            bVar1 = ON_BinaryArchive::ReadBool(file,&this->m_bScaleBackgroundToFit);
                            return bVar1;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_3dmRenderSettings::ReadV5( ON_BinaryArchive& file )
{
  bool rc;
  int b, i;
  int version;
  rc = false;
  for(;;)
  {
    version = 0;
    if ( !file.ReadInt( &version ) )
      break;
    if ( version < 100 )
      break;
    if ( version >= 200 )
      break;
    if ( !file.ReadInt( &b ) )
      break;
    m_bCustomImageSize = (0 != b);
    if ( !file.ReadInt( &m_image_width ) )
      break;
    if ( !file.ReadInt( &m_image_height ) )
      break;
    if ( !file.ReadColor( m_ambient_light ) )
      break;
    if ( !file.ReadInt( &m_background_style ) )
      break;
    if ( !file.ReadColor( m_background_color ) )
      break;
    if ( !file.ReadString( m_background_bitmap_filename ) )
      break;
    if ( !file.ReadInt( &b ) )
      break;
    m_bUseHiddenLights = (0 != b);
    if ( !file.ReadInt( &b ) )
      break;
    m_bDepthCue = (0 != b);
    if ( !file.ReadInt( &b ) )
      break;
    m_bFlatShade = (0 != b);
    if ( !file.ReadInt( &b ) )
      break;
    m_bRenderBackfaces = (0 != b);
    if ( !file.ReadInt( &b ) )
      break;
    m_bRenderPoints = (0 != b);
    if ( !file.ReadInt( &b ) )
      break;
    m_bRenderCurves = (0 != b);
    if ( !file.ReadInt( &b ) )
      break;
    m_bRenderIsoparams = (0 != b);
    if ( !file.ReadInt( &b ) )
      break;
    m_bRenderMeshEdges = (0 != b);
    if ( !file.ReadInt( &b ) )
      break;
    m_bRenderAnnotation = (0 != b);
    if ( !file.ReadInt( &m_antialias_style ) )
      break;
    if ( !file.ReadInt( &m_shadowmap_style ) )
      break;
    if ( !file.ReadInt( &m_shadowmap_width ) )
      break;
    if ( !file.ReadInt( &m_shadowmap_height ) )
      break;
    if ( !file.ReadDouble( &m_shadowmap_offset ) )
      break;
    
    if ( version < 101 )
    {
      rc = true;
      break;
    }
    if ( !file.ReadDouble( &m_image_dpi ) )
      break;
    if ( !file.ReadInt(&i) )
      break;
    m_image_us = ON::LengthUnitSystemFromUnsigned(i);
     
    
    if ( version < 102 )
    {
      rc = true;
      break;
    }
    if ( !file.ReadColor( m_background_bottom_color ) )
      break;

    if ( version < 103 )
    {
      rc = true;
      break;
    }
    if ( !file.ReadBool( &m_bScaleBackgroundToFit ) )
      break;

    rc = true;
    break;
  }

  return rc;
}